

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O2

void start_output_bmp(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo)

{
  J_COLOR_SPACE JVar1;
  uint uVar2;
  jpeg_error_mgr *pjVar3;
  bool bVar4;
  size_t sVar5;
  long lVar6;
  bmp_dest_ptr dest;
  int map_colors;
  bool bVar7;
  undefined4 uStack_42;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined2 uStack_3a;
  byte bStack_38;
  undefined1 uStack_37;
  undefined2 uStack_36;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined4 uStack_30;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined2 uStack_2a;
  
  if (*(int *)&dinfo[1].output_file != 0) {
    return;
  }
  if (*(int *)&dinfo[1].start_output == 0) {
    write_bmp_header(cinfo,(bmp_dest_ptr)dinfo);
    return;
  }
  JVar1 = cinfo->out_color_space;
  bVar4 = false;
  if (JVar1 == JCS_RGB || JVar1 - JCS_EXT_RGB < 10) {
    bVar7 = cinfo->quantize_colors == 0;
    bVar4 = !bVar7;
    bStack_38 = bVar7 << 4 | 8;
    map_colors = (uint)bVar4 << 8;
  }
  else {
    bStack_38 = 0x18;
    if (JVar1 == JCS_CMYK) {
      map_colors = 0;
    }
    else {
      map_colors = 0;
      if (JVar1 != JCS_RGB565) {
        map_colors = 0x100;
        bVar4 = true;
        bStack_38 = 8;
      }
    }
  }
  uVar2 = cinfo->output_height;
  lVar6 = (ulong)*(uint *)((long)&dinfo[1].finish_output + 4) * (ulong)uVar2 +
          (ulong)(uint)(map_colors * 3) + 0x1a;
  uStack_30 = 0;
  uStack_36 = 0x4d42;
  uStack_34 = (undefined1)lVar6;
  uStack_33 = (undefined1)((ulong)lVar6 >> 8);
  uStack_32 = (undefined1)((ulong)lVar6 >> 0x10);
  uStack_31 = (undefined1)((ulong)lVar6 >> 0x18);
  uStack_2c = 0x1a;
  uStack_2b = (undefined1)((uint)(map_colors * 3) >> 8);
  uStack_2a = 0;
  uStack_42 = 0xc;
  uStack_3e = (undefined1)cinfo->output_width;
  uStack_3d = (undefined1)(cinfo->output_width >> 8);
  uStack_3c = (undefined1)uVar2;
  uStack_3b = (undefined1)(uVar2 >> 8);
  uStack_3a = 1;
  uStack_37 = 0;
  sVar5 = fwrite(&uStack_36,1,0xe,(FILE *)dinfo->output_file);
  if (sVar5 != 0xe) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x25;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  sVar5 = fwrite(&uStack_42,1,0xc,(FILE *)dinfo->output_file);
  if (sVar5 != 0xc) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x25;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if (bVar4) {
    write_colormap(cinfo,(bmp_dest_ptr)dinfo,map_colors,3);
    return;
  }
  return;
}

Assistant:

METHODDEF(void)
start_output_bmp(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo)
{
  bmp_dest_ptr dest = (bmp_dest_ptr)dinfo;

  if (!dest->use_inversion_array) {
    /* Write the header and colormap */
    if (dest->is_os2)
      write_os2_header(cinfo, dest);
    else
      write_bmp_header(cinfo, dest);
  }
}